

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hpp
# Opt level: O2

bool __thiscall Experiments::start(Experiments *this)

{
  string *this_00;
  Experiments *this_01;
  uint uVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  int count;
  long lVar6;
  allocator<char> local_341;
  vector<Experiments::Node,_std::allocator<Experiments::Node>_> *local_340;
  Experiments *local_338;
  long local_330;
  string res;
  Node node1;
  vector<Experiments::Node,_std::allocator<Experiments::Node>_> local_2d8;
  Node node2;
  string local_290;
  string local_270;
  string local_250;
  ofstream out;
  string local_228 [32];
  long local_208;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&res,"",(allocator<char> *)&out);
  local_340 = &this->exps;
  lVar6 = 0;
  local_338 = this;
  while (lVar6 < this->size) {
    count = this->buf_sizes[lVar6] << 8;
    InitBuffer(this,count);
    Burn(this,count);
    lVar3 = std::chrono::_V2::system_clock::now();
    lVar4 = std::chrono::_V2::system_clock::now();
    local_330 = lVar6 + 1;
    _out = (uint)local_330;
    std::__cxx11::string::string<std::allocator<char>>
              (local_228,"Forward",(allocator<char> *)&node1);
    local_208 = (lVar4 - lVar3) / 1000000;
    std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back
              (local_340,(value_type *)&out);
    uVar1 = _out;
    std::__cxx11::string::string((string *)&local_250,local_228);
    addDataToString(&res,uVar1,&local_250,local_208,local_338->buf_sizes[lVar6]);
    std::__cxx11::string::~string((string *)&local_250);
    lVar3 = std::chrono::_V2::system_clock::now();
    lVar4 = std::chrono::_V2::system_clock::now();
    node1.id = (uint)local_330;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&node1.name,"Backward",(allocator<char> *)&node2);
    node1.time = (lVar4 - lVar3) / 1000000;
    std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back(local_340,&node1);
    uVar1 = node1.id;
    std::__cxx11::string::string((string *)&local_270,(string *)&node1.name);
    this_01 = local_338;
    addDataToString(&res,uVar1,&local_270,node1.time,local_338->buf_sizes[lVar6]);
    std::__cxx11::string::~string((string *)&local_270);
    lVar3 = std::chrono::_V2::system_clock::now();
    Random(this_01,count);
    lVar4 = std::chrono::_V2::system_clock::now();
    node2.id = (uint)local_330;
    this_00 = &node2.name;
    std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"Random",&local_341);
    node2.time = (lVar4 - lVar3) / 1000000;
    std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::push_back(local_340,&node2);
    uVar1 = node2.id;
    std::__cxx11::string::string((string *)&local_290,(string *)this_00);
    this = local_338;
    addDataToString(&res,uVar1,&local_290,node2.time,local_338->buf_sizes[lVar6]);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)&node1.name);
    std::__cxx11::string::~string(local_228);
    lVar6 = local_330;
  }
  std::ofstream::ofstream(&out);
  std::ofstream::open((char *)&out,0x1040ad);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    poVar5 = std::operator<<((ostream *)&out,(string *)&res);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::vector(&local_2d8,local_340);
  GraphBuild(this,&local_2d8);
  std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::~vector(&local_2d8);
  std::ofstream::~ofstream(&out);
  std::__cxx11::string::~string((string *)&res);
  return true;
}

Assistant:

bool Experiments::start() {
    string res="";
    for (int i = 0; i < size; i++) {
        int value = KBtoSize(buf_sizes[i]);

        InitBuffer(value);
        Burn(value);

        //прямой
        auto tON = std::chrono::high_resolution_clock::now();
        Forward(value);
        auto tOF = std::chrono::high_resolution_clock::now();
        auto dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node{(unsigned int)i+1, "Forward", dF};
        exps.push_back(node);
        addDataToString(res, node.id, node.name, node.time, buf_sizes[i]);

        //обратный
        tON = std::chrono::high_resolution_clock::now();
        Backward(value);
        tOF = std::chrono::high_resolution_clock::now();
        dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node1{(unsigned int)i+1, "Backward", dF};
        exps.push_back(node1);
        addDataToString(res, node1.id, node1.name, node1.time, buf_sizes[i]);

        //случайный
        tON = std::chrono::high_resolution_clock::now();
        Random(value);
        tOF = std::chrono::high_resolution_clock::now();
        dF = std::chrono::duration_cast<std::chrono::milliseconds>(tOF - tON).count();

        Node node2{(unsigned int)i+1, "Random", dF};
        exps.push_back(node2);
        addDataToString(res, node2.id, node2.name, node2.time, buf_sizes[i]);
    }
    std::ofstream out;          // поток для записи
    out.open("..\\result\\data.txt"); // окрываем файл для записи
    if (out.is_open())
    {
        out << res << endl;
    }
    GraphBuild(exps);
    return true;
}